

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

int __thiscall QDateTime::offsetFromUtc(QDateTime *this)

{
  bool bVar1;
  QFlags<QDateTimePrivate::StatusFlag> flags;
  TimeSpec TVar2;
  QDateTimePrivate *pQVar3;
  QDateTimeData *in_RDI;
  long in_FS_OFFSET;
  qint64 unaff_retaddr;
  TimeSpec spec;
  TransitionOptions resolve;
  StatusFlags status;
  TransitionOptions in_stack_0000003c;
  undefined4 in_stack_ffffffffffffffa8;
  QFlagsStorage<QDateTimePrivate::StatusFlag> in_stack_ffffffffffffffac;
  int local_38;
  QFlagsStorage<QDateTimePrivate::StatusFlag> local_24 [3];
  int local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_24[0].i = 0xaaaaaaaa;
  local_24[0].i = (Int)getStatus(in_RDI);
  flags = ::operator|((enum_type)((ulong)in_RDI >> 0x20),(enum_type)in_RDI);
  bVar1 = QFlags<QDateTimePrivate::StatusFlag>::testFlags
                    ((QFlags<QDateTimePrivate::StatusFlag> *)local_24,flags);
  if (bVar1) {
    bVar1 = Data::isShort((Data *)&in_RDI->data);
    if (bVar1) {
      TVar2 = extractSpec((StatusFlags)in_stack_ffffffffffffffac.i);
      if (TVar2 == LocalTime) {
        extractDaylightStatus((StatusFlags)in_stack_ffffffffffffffac.i);
        toTransitionOptions(0x56ec79);
        getMSecs((QDateTimeData *)CONCAT44(in_stack_ffffffffffffffac.i,in_stack_ffffffffffffffa8));
        QDateTimePrivate::localStateAtMillis(unaff_retaddr,in_stack_0000003c);
        local_38 = local_18;
      }
      else {
        local_38 = 0;
      }
    }
    else {
      pQVar3 = Data::operator->((Data *)&in_RDI->data);
      local_38 = pQVar3->m_offsetFromUtc;
    }
  }
  else {
    local_38 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_38;
  }
  __stack_chk_fail();
}

Assistant:

int QDateTime::offsetFromUtc() const
{
    const auto status = getStatus(d);
    if (!status.testFlags(QDateTimePrivate::ValidDate | QDateTimePrivate::ValidTime))
        return 0;
    // But allow invalid date-time (e.g. gap's resolution) to report its offset.
    if (!d.isShort())
        return d->m_offsetFromUtc;

    auto spec = extractSpec(status);
    if (spec == Qt::LocalTime) {
        // We didn't cache the value, so we need to calculate it:
        const auto resolve = toTransitionOptions(extractDaylightStatus(status));
        return QDateTimePrivate::localStateAtMillis(getMSecs(d), resolve).offset;
    }

    Q_ASSERT(spec == Qt::UTC);
    return 0;
}